

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmrc.hpp
# Opt level: O1

string * cmrc::detail::normalize_path(string *__return_storage_ptr__,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_type __pos;
  long lVar5;
  ulong uVar6;
  
  lVar5 = std::__cxx11::string::find((char *)path,0x1040c0,0);
  while (lVar5 == 0) {
    std::__cxx11::string::_M_erase((ulong)path,0);
    lVar5 = std::__cxx11::string::find((char *)path,0x1040c0,0);
  }
  sVar2 = path->_M_string_length;
  while ((sVar2 != 0 &&
         (lVar5 = std::__cxx11::string::rfind((char *)path,0x1040c0,0xffffffffffffffff),
         lVar5 == path->_M_string_length - 1))) {
    std::__cxx11::string::pop_back();
    sVar2 = path->_M_string_length;
  }
  uVar6 = std::__cxx11::string::find((char *)path,0x1040bf,0);
  while (uVar6 != 0xffffffffffffffff) {
    std::__cxx11::string::_M_erase((ulong)path,uVar6);
    uVar6 = std::__cxx11::string::find((char *)path,0x1040bf,0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (path->_M_dataplus)._M_p;
  paVar1 = &path->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&path->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = path->_M_string_length;
  (path->_M_dataplus)._M_p = (pointer)paVar1;
  path->_M_string_length = 0;
  (path->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline std::string normalize_path(std::string path) {
    while (path.find("/") == 0) {
        path.erase(path.begin());
    }
    while (!path.empty() && (path.rfind("/") == path.size() - 1)) {
        path.pop_back();
    }
    auto off = path.npos;
    while ((off = path.find("//")) != path.npos) {
        path.erase(path.begin() + static_cast<std::string::difference_type>(off));
    }
    return path;
}